

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O2

void __thiscall OpenMD::RNEMD::SPFForceManager::combineForcesAndTorques(SPFForceManager *this)

{
  Molecule *pMVar1;
  StuntDouble *this_00;
  pointer ppSVar2;
  double dVar3;
  double dVar4;
  MoleculeIterator mi;
  pointer local_38;
  MoleculeIterator local_28;
  
  local_28._M_node = (_Base_ptr)0x0;
  Snapshot::getSPFData((Snapshot *)&stack0xffffffffffffffc8);
  dVar3 = pow(local_38[1].super_Vector<double,_3U>.data_[0],(double)this->k_);
  dVar4 = 1.0;
  if (dVar3 <= 1.0) {
    dVar4 = dVar3;
  }
  dVar4 = (double)(~-(ulong)(dVar3 < 0.0) & (ulong)dVar4);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffd0);
  pMVar1 = SimInfo::beginMolecule((this->super_ForceManager).info_,&stack0xffffffffffffffd8);
  while (pMVar1 != (Molecule *)0x0) {
    ppSVar2 = (pMVar1->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar2 !=
        (pMVar1->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001f22d7;
    this_00 = (StuntDouble *)0x0;
    while (this_00 != (StuntDouble *)0x0) {
      StuntDouble::combineForcesAndTorques
                (this_00,this->temporarySourceSnapshot_,this->temporarySinkSnapshot_,1.0 - dVar4,
                 dVar4);
      ppSVar2 = ppSVar2 + 1;
      this_00 = (StuntDouble *)0x0;
      if (ppSVar2 !=
          (pMVar1->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001f22d7:
        this_00 = *ppSVar2;
      }
    }
    pMVar1 = SimInfo::nextMolecule((this->super_ForceManager).info_,&stack0xffffffffffffffd8);
  }
  return;
}

Assistant:

void SPFForceManager::combineForcesAndTorques() {
    // Calculate lambda-averaged forces on all atoms and potentials:
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::IntegrableObjectIterator ii;
    StuntDouble* sd;

    RealType result = f_lambda(currentSnapshot_->getSPFData()->lambda);

    // Now scale forces and torques of all the sds
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ii); sd != NULL;
           sd = mol->nextIntegrableObject(ii)) {
        sd->combineForcesAndTorques(temporarySourceSnapshot_,
                                    temporarySinkSnapshot_, 1.0 - result,
                                    result);
      }
    }
  }